

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

void __thiscall QIconLoader::setThemeName(QIconLoader *this,QString *themeName)

{
  long lVar1;
  QDebug this_00;
  char cVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QByteArrayView QVar5;
  QStringView QVar6;
  QDebug local_80;
  QArrayDataPointer<QString> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->m_userTheme).d.size;
  if (lVar1 == (themeName->d).size) {
    QVar4.m_data = (this->m_userTheme).d.ptr;
    QVar4.m_size = lVar1;
    QVar6.m_data = (themeName->d).ptr;
    QVar6.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar4,QVar6);
    if (cVar2 != '\0') goto LAB_00277894;
  }
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_8_ = (undefined1 *)0x0;
    local_58._12_8_ = (undefined1 *)0x0;
    local_58._20_4_ = 0;
    local_40 = lcIconLoader::category.name;
    QMessageLogger::debug();
    this_00.stream = local_80.stream;
    QVar5.m_data = (storage_type *)0x1a;
    QVar5.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)&local_78);
    if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_80.stream)->space == true) {
      QTextStream::operator<<(&(local_80.stream)->ts,' ');
    }
    pcVar3 = (themeName->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_80,(ulong)pcVar3);
    if ((local_80.stream)->space == true) {
      QTextStream::operator<<(&(local_80.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_80);
  }
  lVar1 = (this->m_userTheme).d.size;
  QString::operator=(&this->m_userTheme,(QString *)themeName);
  if ((lVar1 != 0) && ((this->m_userTheme).d.size == 0)) {
    if (QGuiApplicationPrivate::platform_theme == (QPlatformTheme *)0x0) {
LAB_0027785f:
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x0;
      local_78.size = 0;
    }
    else {
      local_58._20_4_ = 0xaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._12_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
                (&local_58,QGuiApplicationPrivate::platform_theme,0x10);
      if (local_40 < (char *)0x4) {
        ::QVariant::~QVariant((QVariant *)&local_58);
        goto LAB_0027785f;
      }
      ::QVariant::toStringList();
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    setThemeSearchPath(this,(QStringList *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
  this->m_themeKey = this->m_themeKey + 1;
  if ((this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
      super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged == true) {
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = false;
  }
LAB_00277894:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconLoader::setThemeName(const QString &themeName)
{
    if (m_userTheme == themeName)
        return;

    qCDebug(lcIconLoader) << "Setting user theme name to" << themeName;

    const bool hadUserTheme = hasUserTheme();
    m_userTheme = themeName;
    // if we cleared the user theme, then reset search paths as well,
    // otherwise we'll keep looking in the user-defined search paths for
    // a system-provide theme, which will never work.
    if (!hasUserTheme() && hadUserTheme)
        setThemeSearchPath(systemIconSearchPaths());
    invalidateKey();
}